

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kazsignal.h
# Opt level: O0

int __thiscall
sig::ProtoSignal<void_()>::connect
          (ProtoSignal<void_()> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  ProtoSignal<void_()> *this_00;
  shared_ptr<sig::ConnectionImpl> local_90 [2];
  value_type local_70;
  ProtoSignal<void_()> *local_40;
  undefined1 local_38 [8];
  shared_ptr<sig::ConnectionImpl> conn_impl;
  size_t id;
  callback *func_local;
  ProtoSignal<void_()> *this_local;
  
  this_00 = (ProtoSignal<void_()> *)CONCAT44(in_register_00000034,__fd);
  conn_impl.super___shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)increment_counter(this_00);
  local_40 = this_00;
  std::make_shared<sig::ConnectionImpl,sig::ProtoSignal<void()>*,unsigned_long&>
            ((ProtoSignal<void_()> **)local_38,(unsigned_long *)&local_40);
  std::function<void_()>::function(&local_70.func,(function<void_()> *)__addr);
  std::shared_ptr<sig::ConnectionImpl>::shared_ptr
            (&local_70.conn_impl,(shared_ptr<sig::ConnectionImpl> *)local_38);
  threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::push_back(&this_00->links_,&local_70);
  Link::~Link(&local_70);
  std::shared_ptr<sig::ConnectionImpl>::shared_ptr
            (local_90,(shared_ptr<sig::ConnectionImpl> *)local_38);
  Connection::Connection((Connection *)this,local_90);
  std::shared_ptr<sig::ConnectionImpl>::~shared_ptr(local_90);
  std::shared_ptr<sig::ConnectionImpl>::~shared_ptr((shared_ptr<sig::ConnectionImpl> *)local_38);
  return (int)this;
}

Assistant:

Connection connect(const callback& func) {
        size_t id = increment_counter();
        auto conn_impl = std::make_shared<ConnectionImpl>(this, id);
        links_.push_back({func, conn_impl});
        return Connection(conn_impl);
    }